

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

Fl_Type * sort(Fl_Type *parent)

{
  Fl_Type *this;
  Fl_Widget *this_00;
  int iVar1;
  int iVar2;
  Fl_Type *pFVar3;
  Fl_Type *local_40;
  Fl_Widget *gw;
  Fl_Type *g;
  Fl_Widget *fw;
  Fl_Type *n;
  Fl_Type *f;
  Fl_Type *parent_local;
  
  if (parent == (Fl_Type *)0x0) {
    local_40 = Fl_Type::first;
  }
  else {
    local_40 = parent->next;
  }
  n = local_40;
  pFVar3 = n;
  do {
    do {
      n = pFVar3;
      if ((n == (Fl_Type *)0x0) || ((parent != (Fl_Type *)0x0 && (n->level <= parent->level)))) {
        return n;
      }
      pFVar3 = sort(n);
    } while (((n->selected == '\0') || (iVar1 = (*n->_vptr_Fl_Type[0x17])(), iVar1 == 0)) ||
            (iVar1 = (*n->_vptr_Fl_Type[0x1e])(), iVar1 != 0));
    this = n[1].prev;
    for (gw = (Fl_Widget *)parent->next; (Fl_Type *)gw != n; gw = *(Fl_Widget **)&(gw->label_).color
        ) {
      if ((*(char *)((long)&(gw->label_).deimage + 1) != '\0') && ((gw->label_).font <= n->level)) {
        this_00 = *(Fl_Widget **)&gw[1].label_.type;
        iVar1 = Fl_Widget::y(this_00);
        iVar2 = Fl_Widget::y((Fl_Widget *)this);
        if (iVar2 < iVar1) break;
        iVar1 = Fl_Widget::y(this_00);
        iVar2 = Fl_Widget::y((Fl_Widget *)this);
        if (iVar1 == iVar2) {
          iVar1 = Fl_Widget::x(this_00);
          iVar2 = Fl_Widget::x((Fl_Widget *)this);
          if (iVar2 < iVar1) break;
        }
      }
    }
    if ((Fl_Type *)gw != n) {
      Fl_Type::move_before(n,(Fl_Type *)gw);
    }
  } while( true );
}

Assistant:

Fl_Type *sort(Fl_Type *parent) {
  Fl_Type *f,*n=0;
  for (f = parent ? parent->next : Fl_Type::first; ; f = n) {
    if (!f || (parent && f->level <= parent->level)) return f;
    n = sort(f);
    if (!f->selected || (!f->is_widget() || f->is_menu_item())) continue;
    Fl_Widget* fw = ((Fl_Widget_Type*)f)->o;
    Fl_Type *g; // we will insert before this
    for (g = parent->next; g != f; g = g->next) {
      if (!g->selected || g->level > f->level) continue;
      Fl_Widget* gw = ((Fl_Widget_Type*)g)->o;
      if (gw->y() > fw->y()) break;
      if (gw->y() == fw->y() && gw->x() > fw->x()) break;
    }
    if (g != f) f->move_before(g);
  }
}